

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCec.c
# Opt level: O1

int Cec_ManVerifyNaive(Gia_Man_t *p,Cec_ParCec_t *pPars)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  sat_solver *psVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int pLits [2];
  timespec ts;
  uint local_a4;
  ulong local_90;
  uint local_84;
  uint local_80;
  uint local_7c;
  sat_solver *local_78;
  uint local_6c;
  ProgressBar *local_68;
  Cec_ParCec_t *local_60;
  timespec local_58;
  long local_48;
  Cnf_Dat_t *local_40;
  ulong local_38;
  
  local_60 = pPars;
  local_40 = Mf_ManGenerateCnf(p,8,0,0,0);
  psVar10 = (sat_solver *)Cnf_DataWriteIntoSolver(local_40,1,0);
  iVar6 = clock_gettime(3,&local_58);
  if (iVar6 < 0) {
    local_48 = -1;
  }
  else {
    local_48 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  iVar6 = p->vCos->nSize - p->nRegs;
  local_6c = iVar6 / 2;
  local_78 = psVar10;
  local_68 = Extra_ProgressBarStart(_stdout,local_6c);
  if ((p->vCos->nSize - p->nRegs & 1U) != 0) {
    __assert_fail("Gia_ManPoNum(p) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCec.c"
                  ,0xed,"int Cec_ManVerifyNaive(Gia_Man_t *, Cec_ParCec_t *)");
  }
  local_84 = 0;
  uVar8 = 0;
  local_90 = 0;
  local_a4 = 0;
  if (1 < iVar6) {
    local_38 = (ulong)local_6c;
    lVar14 = 1;
    uVar13 = 0;
    local_90 = 0;
    uVar8 = 0;
    local_84 = 0;
    local_a4 = 0;
    do {
      if (((char)uVar13 == '\0') &&
         ((local_68 == (ProgressBar *)0x0 || ((long)local_68->nItemsNext <= (long)uVar13)))) {
        Extra_ProgressBarUpdate_int(local_68,(int)uVar13,(char *)0x0);
      }
      lVar11 = (long)p->vCos->nSize;
      lVar12 = lVar11 - p->nRegs;
      if (lVar12 <= lVar14 + -1) {
LAB_0059ed33:
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (lVar11 <= lVar14 + -1) {
LAB_0059ed14:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar4 = p->vCos->pArray;
      iVar6 = piVar4[uVar13 * 2];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
LAB_0059ecf5:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if ((int)lVar12 <= lVar14) goto LAB_0059ed33;
      if (lVar11 <= lVar14) goto LAB_0059ed14;
      iVar7 = piVar4[uVar13 * 2 + 1];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_0059ecf5;
      pGVar1 = p->pObjs + iVar6;
      pGVar2 = p->pObjs + iVar7;
      iVar6 = (int)local_90;
      if (((ulong)((uint)(*(ulong *)pGVar1 >> 0x1d) & 1) ^
          (ulong)(pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff))) ==
          ((ulong)((uint)(*(ulong *)pGVar2 >> 0x1d) & 1) ^
          (ulong)(pGVar2 + -(*(ulong *)pGVar2 & 0x1fffffff)))) {
        local_90 = (ulong)(iVar6 + 1);
        local_84 = local_84 + 1;
      }
      else {
        if (local_60->TimeLimit != 0) {
          iVar7 = clock_gettime(3,&local_58);
          if (iVar7 < 0) {
            lVar11 = -1;
          }
          else {
            lVar11 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
          }
          if ((long)local_60->TimeLimit <= (lVar11 - local_48) / 1000000) {
            printf("Timeout (%d sec) is reached.\n");
            local_a4 = local_6c - (uVar8 + iVar6);
            break;
          }
        }
        pGVar5 = p->pObjs;
        if ((((pGVar1 < pGVar5) || (pGVar5 + p->nObjs <= pGVar1)) || (pGVar2 < pGVar5)) ||
           (pGVar5 + p->nObjs <= pGVar2)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar7 = local_40->pVarNums[(int)((ulong)((long)pGVar1 - (long)pGVar5) >> 2) * -0x55555555];
        if ((iVar7 < 0) ||
           (iVar3 = local_40->pVarNums
                    [(int)((ulong)((long)pGVar2 - (long)pGVar5) >> 2) * -0x55555555], iVar3 < 0)) {
          __assert_fail("iVar0 >= 0 && iVar1 >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCec.c"
                        ,0x102,"int Cec_ManVerifyNaive(Gia_Man_t *, Cec_ParCec_t *)");
        }
        local_7c = iVar3 * 2;
        local_80 = iVar7 * 2 + 1;
        iVar7 = sat_solver_solve(local_78,(lit *)&local_80,(lit *)&local_78,(long)local_60->nBTLimit
                                 ,0,0,0);
        psVar10 = local_78;
        if (iVar7 == 1) {
LAB_0059eba5:
          printf("Output %d is SAT.\n",uVar13 & 0xffffffff);
          uVar8 = uVar8 + 1;
        }
        else {
          if (iVar7 == -1) {
            local_80 = local_80 ^ 1;
            local_7c = local_7c ^ 1;
            iVar7 = sat_solver_addclause(local_78,(lit *)&local_80,(lit *)&local_78);
            if (iVar7 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCec.c"
                            ,0x10d,"int Cec_ManVerifyNaive(Gia_Man_t *, Cec_ParCec_t *)");
            }
            iVar7 = sat_solver_solve(psVar10,(lit *)&local_80,(lit *)&local_78,
                                     (long)local_60->nBTLimit,0,0,0);
            if (iVar7 == 1) goto LAB_0059eba5;
            if (iVar7 == -1) {
              local_80 = local_80 ^ 1;
              local_7c = local_7c ^ 1;
              iVar7 = sat_solver_addclause(local_78,(lit *)&local_80,(lit *)&local_78);
              if (iVar7 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCec.c"
                              ,0x121,"int Cec_ManVerifyNaive(Gia_Man_t *, Cec_ParCec_t *)");
              }
              local_90 = (ulong)(iVar6 + 1);
              goto LAB_0059ebcd;
            }
          }
          local_a4 = local_a4 + 1;
        }
      }
LAB_0059ebcd:
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 2;
    } while (local_38 != uVar13);
  }
  Extra_ProgressBarStop(local_68);
  printf("UNSAT = %6d.  SAT = %6d.   UNDEC = %6d.  Trivial = %6d.  ",local_90,(ulong)uVar8,
         (ulong)local_a4,(ulong)local_84);
  iVar7 = 3;
  iVar6 = clock_gettime(3,&local_58);
  psVar10 = local_78;
  if (iVar6 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  lVar14 = lVar14 - local_48;
  Abc_Print(iVar7,"%s =","Time");
  Abc_Print(iVar7,"%9.2f sec\n",(double)lVar14 / 1000000.0);
  Cnf_DataFree(local_40);
  sat_solver_delete(psVar10);
  uVar9 = -(uint)(local_a4 != 0) | 1;
  if (uVar8 != 0) {
    uVar9 = 0;
  }
  return uVar9;
}

Assistant:

int Cec_ManVerifyNaive( Gia_Man_t * p, Cec_ParCec_t * pPars )
{
    extern Cnf_Dat_t * Mf_ManGenerateCnf( Gia_Man_t * pGia, int nLutSize, int fCnfObjIds, int fAddOrCla, int fVerbose );
    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( p, 8, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    Gia_Obj_t * pObj0, * pObj1;
    abctime clkStart = Abc_Clock();
    int nPairs = Gia_ManPoNum(p)/2;
    int nUnsats = 0, nSats = 0, nUndecs = 0, nTrivs = 0;
    int i, iVar0, iVar1, pLits[2], status, RetValue;
    ProgressBar * pProgress = Extra_ProgressBarStart( stdout, nPairs );
    assert( Gia_ManPoNum(p) % 2 == 0 );
    for ( i = 0; i < nPairs; i++ )
    {
        if ( (i & 0xFF) == 0 )
            Extra_ProgressBarUpdate( pProgress, i, NULL );
        pObj0 = Gia_ManPo(p, 2*i);
        pObj1 = Gia_ManPo(p, 2*i+1);
        if ( Gia_ObjChild0(pObj0) == Gia_ObjChild0(pObj1) )
        {
            nUnsats++;
            nTrivs++;
            continue;
        }
        if ( pPars->TimeLimit && (Abc_Clock() - clkStart)/CLOCKS_PER_SEC >= pPars->TimeLimit )
        {
            printf( "Timeout (%d sec) is reached.\n", pPars->TimeLimit );
            nUndecs = nPairs - nUnsats - nSats;
            break;
        }
        iVar0 = pCnf->pVarNums[ Gia_ObjId(p, pObj0) ];
        iVar1 = pCnf->pVarNums[ Gia_ObjId(p, pObj1) ];
        assert( iVar0 >= 0 && iVar1 >= 0 );
        pLits[0] = Abc_Var2Lit( iVar0, 0 );
        pLits[1] = Abc_Var2Lit( iVar1, 0 );
        // check direct
        pLits[0] = lit_neg(pLits[0]);
        status = sat_solver_solve( pSat, pLits, pLits + 2, pPars->nBTLimit, 0, 0, 0 );
        if ( status == l_False )
        {
            pLits[0] = lit_neg( pLits[0] );
            pLits[1] = lit_neg( pLits[1] );
            RetValue = sat_solver_addclause( pSat, pLits, pLits + 2 );
            assert( RetValue );
        }
        else if ( status == l_True )
        {
            printf( "Output %d is SAT.\n", i );
            nSats++;
            continue;
        }
        else
        {
            nUndecs++;
            continue;
        }
        // check inverse
        status = sat_solver_solve( pSat, pLits, pLits + 2, pPars->nBTLimit, 0, 0, 0 );
        if ( status == l_False )
        {
            pLits[0] = lit_neg( pLits[0] );
            pLits[1] = lit_neg( pLits[1] );
            RetValue = sat_solver_addclause( pSat, pLits, pLits + 2 );
            assert( RetValue );
        }
        else if ( status == l_True )
        {
            printf( "Output %d is SAT.\n", i );
            nSats++;
            continue;
        }
        else
        {
            nUndecs++;
            continue;
        }
        nUnsats++;
    }
    Extra_ProgressBarStop( pProgress );
    printf( "UNSAT = %6d.  SAT = %6d.   UNDEC = %6d.  Trivial = %6d.  ", nUnsats, nSats, nUndecs, nTrivs );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    if ( nSats )
        return 0;
    if ( nUndecs )
        return -1;
    return 1;
}